

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall
re2::RE2::DoMatch(RE2 *this,StringPiece *text,Anchor anchor,int *consumed,Arg **args,int n)

{
  Arg **ppAVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  StringPiece *submatch;
  StringPiece *pSVar6;
  long lVar7;
  ulong uVar8;
  uint nsubmatch;
  StringPiece *pSVar9;
  ulong uVar10;
  Arg **local_1c0;
  StringPiece stkvec [17];
  
  if (this->error_code_ != NoError) {
    if ((this->options_).log_errors_ == true) {
      LogMessage::LogMessage
                ((LogMessage *)stkvec,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x326
                 ,2);
      poVar5 = std::operator<<((ostream *)&stkvec[0].length_,"Invalid RE2: ");
      std::operator<<(poVar5,(string *)this->error_);
      LogMessage::~LogMessage((LogMessage *)stkvec);
    }
    return false;
  }
  lVar7 = 8;
  do {
    *(undefined8 *)((long)stkvec + lVar7 + -8) = 0;
    *(undefined4 *)((long)&stkvec[0].ptr_ + lVar7) = 0;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x118);
  nsubmatch = n + 1U;
  if (n == 0) {
    nsubmatch = 0;
  }
  if (consumed != (int *)0x0) {
    nsubmatch = n + 1U;
  }
  local_1c0 = args;
  if ((int)nsubmatch < 0x12) {
    submatch = stkvec;
    pSVar9 = (StringPiece *)0x0;
  }
  else {
    submatch = (StringPiece *)operator_new__((ulong)nsubmatch * 0x10);
    pSVar6 = submatch;
    do {
      pSVar6->ptr_ = (char *)0x0;
      pSVar6->length_ = 0;
      pSVar6 = pSVar6 + 1;
      pSVar9 = submatch;
    } while (pSVar6 != submatch + nsubmatch);
  }
  bVar2 = Match(this,text,0,text->length_,anchor,submatch,nsubmatch);
  ppAVar1 = local_1c0;
  if (bVar2) {
    if (consumed != (int *)0x0) {
      *consumed = (*(int *)&submatch->ptr_ + submatch->length_) - *(int *)&text->ptr_;
    }
    if (local_1c0 == (Arg **)0x0 || n == 0) {
      bVar2 = true;
      goto joined_r0x00136de8;
    }
    iVar4 = NumberOfCapturingGroups(this);
    if (n <= iVar4) {
      uVar10 = 0;
      uVar8 = (ulong)(uint)n;
      if (n < 1) {
        uVar8 = uVar10;
      }
      do {
        if (uVar8 * 8 == uVar10) {
          bVar2 = true;
          goto joined_r0x00136de8;
        }
        cVar3 = (*(code *)(*(undefined8 **)((long)ppAVar1 + uVar10))[1])
                          (*(undefined8 *)((long)&submatch[1].ptr_ + uVar10 * 2),
                           *(undefined4 *)((long)&submatch[1].length_ + uVar10 * 2),
                           **(undefined8 **)((long)ppAVar1 + uVar10));
        uVar10 = uVar10 + 8;
      } while (cVar3 != '\0');
      bVar2 = false;
      goto joined_r0x00136de8;
    }
  }
  bVar2 = false;
joined_r0x00136de8:
  if (pSVar9 != (StringPiece *)0x0) {
    operator_delete__(pSVar9);
  }
  return bVar2;
}

Assistant:

bool RE2::DoMatch(const StringPiece& text,
                  Anchor anchor,
                  int* consumed,
                  const Arg* const* args,
                  int n) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  // Count number of capture groups needed.
  int nvec;
  if (n == 0 && consumed == NULL)
    nvec = 0;
  else
    nvec = n+1;

  StringPiece* vec;
  StringPiece stkvec[kVecSize];
  StringPiece* heapvec = NULL;

  if (nvec <= arraysize(stkvec)) {
    vec = stkvec;
  } else {
    vec = new StringPiece[nvec];
    heapvec = vec;
  }

  if (!Match(text, 0, text.size(), anchor, vec, nvec)) {
    delete[] heapvec;
    return false;
  }

  if (consumed != NULL)
    *consumed = static_cast<int>(vec[0].end() - text.begin());

  if (n == 0 || args == NULL) {
    // We are not interested in results
    delete[] heapvec;
    return true;
  }

  int ncap = NumberOfCapturingGroups();
  if (ncap < n) {
    // RE has fewer capturing groups than number of arg pointers passed in
    VLOG(1) << "Asked for " << n << " but only have " << ncap;
    delete[] heapvec;
    return false;
  }

  // If we got here, we must have matched the whole pattern.
  for (int i = 0; i < n; i++) {
    const StringPiece& s = vec[i+1];
    if (!args[i]->Parse(s.data(), s.size())) {
      // TODO: Should we indicate what the error was?
      VLOG(1) << "Parse error on #" << i << " " << s << " "
              << (void*)s.data() << "/" << s.size();
      delete[] heapvec;
      return false;
    }
  }

  delete[] heapvec;
  return true;
}